

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall
nvim::Nvim::buf_set_keymap
          (Nvim *this,Buffer buffer,string *mode,string *lhs,string *rhs,Dictionary *opts)

{
  allocator local_59;
  string local_58;
  Dictionary *local_38;
  Dictionary *opts_local;
  string *rhs_local;
  string *lhs_local;
  string *mode_local;
  Buffer buffer_local;
  Nvim *this_local;
  
  local_38 = opts;
  opts_local = (Dictionary *)rhs;
  rhs_local = lhs;
  lhs_local = mode;
  mode_local = (string *)buffer;
  buffer_local = (Buffer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"nvim_buf_set_keymap",&local_59);
  NvimRPC::
  call<long,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::multimap<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::less<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>,std::allocator<std::pair<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>const,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>>>
            (&this->client_,&local_58,(nullptr_t)0x0,(long *)&mode_local,lhs_local,rhs_local,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)opts_local,
             local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return;
}

Assistant:

void Nvim::buf_set_keymap(Buffer buffer, const std::string& mode, const std::string& lhs, const std::string& rhs, const Dictionary& opts) {
    client_.call("nvim_buf_set_keymap", nullptr, buffer, mode, lhs, rhs, opts);
}